

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O2

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  size_t local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  ComparatorFactory::getComparatorForFile((ComparatorFactory *)&local_28,(string *)ctx);
  verify(ctx,sig,local_28,tbs,tbslen);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return extraout_EAX;
}

Assistant:

void FileApprover::verify(const std::string& receivedPath,
                              const std::string& approvedPath)
    {
        verify(receivedPath,
               approvedPath,
               *ComparatorFactory::getComparatorForFile(receivedPath));
    }